

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Module * sqlite3VtabCreateModule
                   (sqlite3 *db,char *zName,sqlite3_module *pModule,void *pAux,
                   _func_void_void_ptr *xDestroy)

{
  byte *pbVar1;
  Table *pTable;
  size_t sVar2;
  Module *data;
  Module *pMVar3;
  uint uVar4;
  
  data = (Module *)0x0;
  uVar4 = 0;
  pMVar3 = (Module *)zName;
  if (pModule != (sqlite3_module *)0x0) {
    if (zName != (char *)0x0) {
      sVar2 = strlen(zName);
      uVar4 = (uint)sVar2 & 0x3fffffff;
    }
    data = (Module *)sqlite3Malloc((ulong)(uVar4 + 0x31));
    if (data == (Module *)0x0) {
      sqlite3OomFault(db);
      return (Module *)0x0;
    }
    pMVar3 = data + 1;
    memcpy(pMVar3,zName,(ulong)(uVar4 + 1));
    data->zName = (char *)pMVar3;
    data->pModule = pModule;
    data->pAux = pAux;
    data->xDestroy = xDestroy;
    data->pEpoTab = (Table *)0x0;
    data->nRefModule = 1;
  }
  pMVar3 = (Module *)sqlite3HashInsert(&db->aModule,(char *)pMVar3,data);
  if (pMVar3 == (Module *)0x0) {
    return data;
  }
  if (pMVar3 == data) {
    sqlite3OomFault(db);
    sqlite3DbFreeNN(db,pMVar3);
    return (Module *)0x0;
  }
  pTable = pMVar3->pEpoTab;
  if (pTable != (Table *)0x0) {
    pbVar1 = (byte *)((long)&pTable->tabFlags + 1);
    *pbVar1 = *pbVar1 | 0x40;
    sqlite3DeleteTable(db,pTable);
    pMVar3->pEpoTab = (Table *)0x0;
  }
  sqlite3VtabModuleUnref(db,pMVar3);
  return data;
}

Assistant:

SQLITE_PRIVATE Module *sqlite3VtabCreateModule(
  sqlite3 *db,                    /* Database in which module is registered */
  const char *zName,              /* Name assigned to this module */
  const sqlite3_module *pModule,  /* The definition of the module */
  void *pAux,                     /* Context pointer for xCreate/xConnect */
  void (*xDestroy)(void *)        /* Module destructor function */
){
  Module *pMod;
  Module *pDel;
  char *zCopy;
  if( pModule==0 ){
    zCopy = (char*)zName;
    pMod = 0;
  }else{
    int nName = sqlite3Strlen30(zName);
    pMod = (Module *)sqlite3Malloc(sizeof(Module) + nName + 1);
    if( pMod==0 ){
      sqlite3OomFault(db);
      return 0;
    }
    zCopy = (char *)(&pMod[1]);
    memcpy(zCopy, zName, nName+1);
    pMod->zName = zCopy;
    pMod->pModule = pModule;
    pMod->pAux = pAux;
    pMod->xDestroy = xDestroy;
    pMod->pEpoTab = 0;
    pMod->nRefModule = 1;
  }
  pDel = (Module *)sqlite3HashInsert(&db->aModule,zCopy,(void*)pMod);
  if( pDel ){
    if( pDel==pMod ){
      sqlite3OomFault(db);
      sqlite3DbFree(db, pDel);
      pMod = 0;
    }else{
      sqlite3VtabEponymousTableClear(db, pDel);
      sqlite3VtabModuleUnref(db, pDel);
    }
  }
  return pMod;
}